

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_stack.hpp
# Opt level: O0

void __thiscall
boost::xpressive::detail::
sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
::chunk::chunk(chunk *this,size_t size,
              sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *t,size_t count,chunk *back,chunk *next)

{
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *psVar1;
  long in_RCX;
  sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *in_RDX;
  size_t in_RSI;
  long *in_RDI;
  long in_R8;
  long in_R9;
  
  psVar1 = sequence_stack<boost::xpressive::detail::sub_match_impl<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::allocate(in_RSI,in_RDX);
  *in_RDI = (long)psVar1;
  in_RDI[1] = *in_RDI + in_RCX * 0x28;
  in_RDI[2] = *in_RDI + in_RSI * 0x28;
  in_RDI[3] = in_R8;
  in_RDI[4] = in_R9;
  if (in_RDI[3] != 0) {
    *(long **)(in_RDI[3] + 0x20) = in_RDI;
  }
  if (in_RDI[4] != 0) {
    *(long **)(in_RDI[4] + 0x18) = in_RDI;
  }
  return;
}

Assistant:

chunk(std::size_t size, T const &t, std::size_t count, chunk *back, chunk *next)
          : begin_(allocate(size, t))
          , curr_(begin_ + count)
          , end_(begin_ + size)
          , back_(back)
          , next_(next)
        {
            if(this->back_)
                this->back_->next_ = this;
            if(this->next_)
                this->next_->back_ = this;
        }